

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipAnalysis.cpp
# Opt level: O0

void __thiscall HighsMipAnalysis::reportMipSolveLpClock(HighsMipAnalysis *this,bool header)

{
  int __fd;
  int __fd_00;
  int __fd_01;
  int iVar1;
  uint uVar2;
  uint uVar3;
  reference pvVar4;
  uint *puVar5;
  uint uVar6;
  size_t in_RCX;
  void *in_RDX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  byte in_SIL;
  long in_RDI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double dVar7;
  double extraout_XMM0_Qa_02;
  double average_simplex_no_basis_solve_time;
  double average_simplex_basis_solve_time;
  double frac_ipm_solve_time;
  double frac_simplex_solve_time;
  double ipm_solve_time;
  double simplex_solve_time;
  double simplex_no_basis_solve_time;
  double simplex_basis_solve_time;
  HighsInt num_simplex_solve;
  HighsInt num_ipm_solve;
  HighsInt num_simplex_no_basis_solve;
  HighsInt num_simplex_basis_solve;
  HighsInt ipm_solve_iclock;
  HighsInt simplex_no_basis_solve_iclock;
  HighsInt simplex_basis_solve_iclock;
  double total_time;
  double local_90;
  double local_88;
  size_t __nbytes;
  
  if ((in_SIL & 1) == 0) {
    if (((*(byte *)(in_RDI + 0x48) & 1) != 0) &&
       (HighsTimer::read(*(HighsTimer **)(in_RDI + 0x28),0,in_RDX,in_RCX), 0.01 <= extraout_XMM0_Qa)
       ) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x30),0x39);
      __fd = *pvVar4;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x30),0x3a);
      __fd_00 = *pvVar4;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x30),0x3b);
      __fd_01 = *pvVar4;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(*(long *)(in_RDI + 0x28) + 0x18),
                          (long)__fd);
      iVar1 = *pvVar4;
      puVar5 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)
                                  (*(long *)(in_RDI + 0x28) + 0x18),(long)__fd_00);
      uVar2 = *puVar5;
      puVar5 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)
                                  (*(long *)(in_RDI + 0x28) + 0x18),(long)__fd_01);
      uVar3 = *puVar5;
      uVar6 = iVar1 + uVar2;
      __nbytes = (size_t)uVar6;
      HighsTimer::read(*(HighsTimer **)(in_RDI + 0x28),__fd,__buf,__nbytes);
      HighsTimer::read(*(HighsTimer **)(in_RDI + 0x28),__fd_00,__buf_00,__nbytes);
      dVar7 = extraout_XMM0_Qa_00 + extraout_XMM0_Qa_01;
      HighsTimer::read(*(HighsTimer **)(in_RDI + 0x28),__fd_01,__buf_01,__nbytes);
      if (iVar1 < 1) {
        local_88 = 0.0;
      }
      else {
        local_88 = extraout_XMM0_Qa_00 / (double)iVar1;
      }
      if ((int)uVar2 < 1) {
        local_90 = 0.0;
      }
      else {
        local_90 = extraout_XMM0_Qa_01 / (double)(int)uVar2;
      }
      printf(",%11.2g,%11.2g,%d,%d,%11.2g,%11.2g,%d,%11.2g,%11.2g\n",dVar7,extraout_XMM0_Qa_02,
             dVar7 / extraout_XMM0_Qa,extraout_XMM0_Qa_02 / extraout_XMM0_Qa,local_88,local_90,
             (ulong)uVar6,(ulong)uVar3,(ulong)uVar2);
      printf("LP solver analysis: %d LP with %d simplex (%11.2g CPU), %d IPM (%11.2g CPU) and %d solved without basis; average simplex solve time (basis/no_basis) = (%11.2g, %11.2g)\n"
             ,dVar7,extraout_XMM0_Qa_02,local_88,local_90,(ulong)(uVar6 + uVar3),(ulong)uVar6,
             (ulong)uVar3,(ulong)uVar2);
    }
  }
  else {
    printf(
          ",simplex time,IPM time,#simplex,#IPM,simplex/total time,IPM/total time,#No basis solve,simplex/#Basis solve,simplex/#No basis solve\n"
          );
  }
  return;
}

Assistant:

void HighsMipAnalysis::reportMipSolveLpClock(const bool header) {
  if (header) {
    printf(
        ",simplex time,IPM time,#simplex,#IPM,simplex/total time,IPM/total "
        "time,#No basis solve,simplex/#Basis solve,simplex/#No basis solve\n");
    return;
  }
  if (!analyse_mip_time) return;
  double total_time = mip_clocks.timer_pointer_->read(0);
  if (total_time < 0.01) return;
  HighsInt simplex_basis_solve_iclock =
      mip_clocks.clock_[kMipClockSimplexBasisSolveLp];
  HighsInt simplex_no_basis_solve_iclock =
      mip_clocks.clock_[kMipClockSimplexNoBasisSolveLp];
  HighsInt ipm_solve_iclock = mip_clocks.clock_[kMipClockIpmSolveLp];
  //  HighsInt num_no_basis_solve =
  //  mip_clocks.timer_pointer_->clock_num_call[no_basis_solve_iclock]; HighsInt
  //  num_basis_solve =
  //  mip_clocks.timer_pointer_->clock_num_call[basis_solve_iclock];
  HighsInt num_simplex_basis_solve =
      mip_clocks.timer_pointer_->clock_num_call[simplex_basis_solve_iclock];
  HighsInt num_simplex_no_basis_solve =
      mip_clocks.timer_pointer_->clock_num_call[simplex_no_basis_solve_iclock];
  HighsInt num_ipm_solve =
      mip_clocks.timer_pointer_->clock_num_call[ipm_solve_iclock];
  HighsInt num_simplex_solve =
      num_simplex_basis_solve + num_simplex_no_basis_solve;
  //  assert(num_no_basis_solve+num_basis_solve == num_simplex_solve);
  double simplex_basis_solve_time =
      mip_clocks.timer_pointer_->read(simplex_basis_solve_iclock);
  double simplex_no_basis_solve_time =
      mip_clocks.timer_pointer_->read(simplex_no_basis_solve_iclock);
  double simplex_solve_time =
      simplex_basis_solve_time + simplex_no_basis_solve_time;
  double ipm_solve_time = mip_clocks.timer_pointer_->read(ipm_solve_iclock);
  double frac_simplex_solve_time = simplex_solve_time / total_time;
  double frac_ipm_solve_time = ipm_solve_time / total_time;
  double average_simplex_basis_solve_time =
      num_simplex_basis_solve > 0
          ? simplex_basis_solve_time / int(num_simplex_basis_solve)
          : 0.0;
  double average_simplex_no_basis_solve_time =
      num_simplex_no_basis_solve > 0
          ? simplex_no_basis_solve_time / int(num_simplex_no_basis_solve)
          : 0.0;
  printf(",%11.2g,%11.2g,%d,%d,%11.2g,%11.2g,%d,%11.2g,%11.2g\n",
         simplex_solve_time, ipm_solve_time, int(num_simplex_solve),
         int(num_ipm_solve), frac_simplex_solve_time, frac_ipm_solve_time,
         int(num_simplex_no_basis_solve), average_simplex_basis_solve_time,
         average_simplex_no_basis_solve_time);
  printf(
      "LP solver analysis: %d LP with %d simplex (%11.2g CPU), %d IPM (%11.2g "
      "CPU) and %d solved without basis; average simplex solve time "
      "(basis/no_basis) = (%11.2g, %11.2g)\n",
      int(num_simplex_solve + num_ipm_solve), int(num_simplex_solve),
      simplex_solve_time, int(num_ipm_solve), ipm_solve_time,
      int(num_simplex_no_basis_solve), average_simplex_basis_solve_time,
      average_simplex_no_basis_solve_time);
}